

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_Root(AMFImporter *this)

{
  string *psVar1;
  size_t *psVar2;
  pointer pcVar3;
  _Rb_tree_node_base *p_Var4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  CAMFImporter_NodeElement *pCVar7;
  _List_node_base *p_Var8;
  undefined8 extraout_RAX;
  AMFImporter *this_00;
  char *__end;
  _Base_ptr *pp_Var9;
  uint uVar10;
  ulong uVar11;
  string an;
  string version;
  string unit;
  undefined1 local_98 [35];
  allocator<char> local_75;
  uint local_74;
  _Rb_tree_node_base *local_70;
  size_t local_68;
  _Rb_tree_node_base local_60;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined4 extraout_var_00;
  
  this_00 = (AMFImporter *)local_98;
  local_60._M_left = (_Base_ptr)&local_40;
  local_60._M_right = (_Base_ptr)0x0;
  local_40 = _S_red;
  local_70 = &local_60;
  local_68 = 0;
  local_60._M_color._0_1_ = _S_red;
  uVar5 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar5) {
    uVar11 = 0;
    local_74 = uVar5;
    do {
      iVar6 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(char *)CONCAT44(extraout_var,iVar6),&local_75);
      iVar6 = std::__cxx11::string::compare(local_98);
      if (iVar6 == 0) {
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar6);
        pp_Var9 = &local_60._M_left;
LAB_003b91c8:
        p_Var4 = pp_Var9[1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)pp_Var9,0,(char *)p_Var4,(ulong)__s);
        uVar5 = local_74;
      }
      else {
        iVar6 = std::__cxx11::string::compare(local_98);
        if (iVar6 == 0) {
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_00,iVar6);
          pp_Var9 = &local_70;
          goto LAB_003b91c8;
        }
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar5 != uVar10);
  }
  if ((this->mUnit)._M_string_length != 0) {
    psVar1 = &this->mUnit;
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if ((((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0)) &&
        (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0)) &&
       ((iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0 &&
        (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 != 0)))) {
LAB_003b9677:
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"unit","");
      Throw_IncorrectAttrValue(this,(string *)local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(local_60._1_7_,(undefined1)local_60._M_color) + 1);
      }
      if (local_60._M_left != (_Base_ptr)&local_40) {
        operator_delete(local_60._M_left,CONCAT71(uStack_3f,local_40) + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
  }
  pCVar7 = (CAMFImporter_NodeElement *)operator_new(0x90);
  pCVar7->Type = 9;
  (pCVar7->ID)._M_dataplus._M_p = (pointer)&(pCVar7->ID).field_2;
  (pCVar7->ID)._M_string_length = 0;
  (pCVar7->ID).field_2._M_local_buf[0] = '\0';
  pCVar7->Parent = (CAMFImporter_NodeElement *)0x0;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar7->Child;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar7->Child;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar7->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Root_008c8f78;
  pCVar7[1]._vptr_CAMFImporter_NodeElement = (_func_int **)&pCVar7[1].ID;
  *(_List_node_base **)&pCVar7[1].Type = (_List_node_base *)0x0;
  *(undefined1 *)&pCVar7[1].ID._M_dataplus._M_p = 0;
  pCVar7[1].ID.field_2._M_allocated_capacity = (size_type)&pCVar7[1].Parent;
  *(undefined8 *)((long)&pCVar7[1].ID.field_2 + 8) = 0;
  *(undefined1 *)&pCVar7[1].Parent = 0;
  this->mNodeElement_Cur = pCVar7;
  std::__cxx11::string::_M_assign((string *)(pCVar7 + 1));
  std::__cxx11::string::_M_assign((string *)pCVar7[1].ID.field_2._M_local_buf);
  iVar6 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar6 == '\0') {
    pcVar3 = local_98 + 0x10;
    do {
      do {
        while( true ) {
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar6 == '\0') {
            local_98._0_8_ = pcVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"amf","");
            Throw_CloseNotFound(this_00,(string *)local_98);
            goto LAB_003b9677;
          }
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          local_98._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"object","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar6 = std::__cxx11::string::compare(local_98);
          if ((pointer)local_98._0_8_ != pcVar3) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          if (iVar6 == 0) {
            ParseNode_Object(this);
          }
          else {
            local_98._0_8_ = pcVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"material","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar6 = std::__cxx11::string::compare(local_98);
            if ((pointer)local_98._0_8_ != pcVar3) {
              operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
            }
            if (iVar6 == 0) {
              ParseNode_Material(this);
            }
            else {
              local_98._0_8_ = pcVar3;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"texture","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar6 = std::__cxx11::string::compare(local_98);
              if ((pointer)local_98._0_8_ != pcVar3) {
                operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
              }
              if (iVar6 == 0) {
                ParseNode_Texture(this);
              }
              else {
                local_98._0_8_ = pcVar3;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_98,"constellation","");
                (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar6 = std::__cxx11::string::compare(local_98);
                if ((pointer)local_98._0_8_ != pcVar3) {
                  operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
                }
                if (iVar6 == 0) {
                  ParseNode_Constellation(this);
                }
                else {
                  local_98._0_8_ = pcVar3;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"metadata","");
                  (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar6 = std::__cxx11::string::compare(local_98);
                  if ((pointer)local_98._0_8_ != pcVar3) {
                    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
                  }
                  if (iVar6 == 0) {
                    ParseNode_Metadata(this);
                  }
                  else {
                    local_98._0_8_ = pcVar3;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"amf","");
                    XML_CheckNode_SkipUnsupported(this,(string *)local_98);
                    if ((pointer)local_98._0_8_ != pcVar3) {
                      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
                    }
                  }
                }
              }
            }
          }
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_98._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"amf","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare(local_98);
      if ((pointer)local_98._0_8_ != pcVar3) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
    } while (iVar6 != 0);
    this->mNodeElement_Cur = pCVar7;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)pCVar7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar2 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._1_7_,(undefined1)local_60._M_color) + 1);
  }
  if (local_60._M_left != (_Base_ptr)&local_40) {
    operator_delete(local_60._M_left,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Root()
{
    std::string unit, version;
    CAMFImporter_NodeElement *ne( nullptr );

	// Read attributes for node <amf>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("unit", unit, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("version", version, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND_WSKIP;

	// Check attributes
	if(!mUnit.empty())
	{
		if((mUnit != "inch") && (mUnit != "millimeter") && (mUnit != "meter") && (mUnit != "feet") && (mUnit != "micron")) Throw_IncorrectAttrValue("unit");
	}

	// create root node element.
	ne = new CAMFImporter_NodeElement_Root(nullptr);
	mNodeElement_Cur = ne;// set first "current" element
	// and assign attribute's values
	((CAMFImporter_NodeElement_Root*)ne)->Unit = unit;
	((CAMFImporter_NodeElement_Root*)ne)->Version = version;

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		MACRO_NODECHECK_LOOPBEGIN("amf");
			if(XML_CheckNode_NameEqual("object")) { ParseNode_Object(); continue; }
			if(XML_CheckNode_NameEqual("material")) { ParseNode_Material(); continue; }
			if(XML_CheckNode_NameEqual("texture")) { ParseNode_Texture(); continue; }
			if(XML_CheckNode_NameEqual("constellation")) { ParseNode_Constellation(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("amf");
		mNodeElement_Cur = ne;// force restore "current" element
	}// if(!mReader->isEmptyElement())

	mNodeElement_List.push_back(ne);// add to node element list because its a new object in graph.
}